

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O1

string * __thiscall
glcts::TestCaseBase::getInfoLog_abi_cxx11_
          (string *__return_storage_ptr__,TestCaseBase *this,LOG_TYPE log_type,GLuint id)

{
  pointer pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  undefined8 *puVar5;
  size_t sVar6;
  TestError *this_00;
  char *pcVar7;
  GLint n_characters;
  vector<char,_std::allocator<char>_> result_vec;
  allocator_type local_45;
  int local_44;
  vector<char,_std::allocator<char>_> local_40;
  long lVar4;
  
  iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  local_44 = 0;
  if (LT_PIPELINE_OBJECT < log_type) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid parameter",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
               ,0x37a);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar4 + *(long *)(&DAT_01b78330 + (ulong)log_type * 8)))(id,0x8b84,&local_44);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Could not query info log length!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                  ,0x37e);
  std::vector<char,_std::allocator<char>_>::vector(&local_40,(long)(local_44 + 1),&local_45);
  if (log_type == LT_SHADER_OBJECT) {
    puVar5 = (undefined8 *)(lVar4 + 0xa58);
  }
  else if (log_type == LT_PROGRAM_OBJECT) {
    puVar5 = (undefined8 *)(lVar4 + 0x988);
  }
  else {
    if (log_type != LT_PIPELINE_OBJECT) goto LAB_00cec16a;
    puVar5 = (undefined8 *)(lVar4 + 0x998);
  }
  (*(code *)*puVar5)(id,local_44 + 1,0,
                     local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
LAB_00cec16a:
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Could not retrieve info log!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                  ,0x391);
  pcVar1 = local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start == (char *)0x0) {
    pcVar7 = &DAT_00000001;
  }
  else {
    sVar6 = strlen(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
    pcVar7 = pcVar1 + sVar6;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar1,pcVar7);
  if (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TestCaseBase::getInfoLog(LOG_TYPE log_type, glw::GLuint id)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint n_characters = 0;
	/* Retrieve amount of characters needed to store the info log (terminator-inclusive) */
	switch (log_type)
	{
	case LT_SHADER_OBJECT:
		gl.getShaderiv(id, GL_INFO_LOG_LENGTH, &n_characters);
		break;
	case LT_PROGRAM_OBJECT:
		gl.getProgramiv(id, GL_INFO_LOG_LENGTH, &n_characters);
		break;
	case LT_PIPELINE_OBJECT:
		gl.getProgramPipelineiv(id, GL_INFO_LOG_LENGTH, &n_characters);
		break;
	default:
		TCU_FAIL("Invalid parameter");
	}

	/* Check if everything is fine so far */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not query info log length!");

	/* Allocate buffer */
	std::vector<char> result_vec(n_characters + 1);

	/* Retrieve the info log */
	switch (log_type)
	{
	case LT_SHADER_OBJECT:
		gl.getShaderInfoLog(id, n_characters + 1, 0, &result_vec[0]);
		break;
	case LT_PROGRAM_OBJECT:
		gl.getProgramInfoLog(id, n_characters + 1, 0, &result_vec[0]);
		break;
	case LT_PIPELINE_OBJECT:
		gl.getProgramPipelineInfoLog(id, n_characters + 1, 0, &result_vec[0]);
		break;
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not retrieve info log!");

	return std::string(&result_vec[0]);
}